

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O0

RayTracerConfig * RayTracerConfig::fromFile(RayTracerConfig *__return_storage_ptr__,string *path)

{
  byte bVar1;
  bool bVar2;
  invalid_argument *piVar3;
  istream *piVar4;
  char *pcVar5;
  void *pvVar6;
  char local_2f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8 [36];
  Plane local_2b4;
  Sphere local_290;
  string local_278 [8];
  string token;
  string local_250 [48];
  istream local_220 [8];
  ifstream file;
  string *path_local;
  RayTracerConfig *config;
  
  std::ifstream::ifstream(local_220,path,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Unable to open file: ");
    std::invalid_argument::invalid_argument(piVar3,local_250);
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  RayTracerConfig(__return_storage_ptr__);
  std::__cxx11::string::string(local_278);
  do {
    piVar4 = std::operator>>(local_220,local_278);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar2) {
      std::__cxx11::string::~string(local_278);
      std::ifstream::~ifstream(local_220);
      return __return_storage_ptr__;
    }
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_278);
    if (*pcVar5 == '#') {
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_278);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_278,"aa");
      if (bVar2) {
        std::istream::operator>>(local_220,(int *)__return_storage_ptr__);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_278,"ambient");
        if (bVar2) {
          std::istream::operator>>
                    (local_220,&(__return_storage_ptr__->super_BaseConfig).ambientCoefficient);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_278,"maxRecursion");
          if (bVar2) {
            std::istream::operator>>
                      (local_220,&(__return_storage_ptr__->super_BaseConfig).maxRecursionLevel);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_278,"depth");
            if (bVar2) {
              std::istream::operator>>(local_220,&(__return_storage_ptr__->super_BaseConfig).imageX)
              ;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_278,"height");
              if (bVar2) {
                std::istream::operator>>
                          (local_220,&(__return_storage_ptr__->super_BaseConfig).imageY);
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_278,"width");
                if (bVar2) {
                  std::istream::operator>>
                            (local_220,&(__return_storage_ptr__->super_BaseConfig).imageZ);
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_278,"observer");
                  if (bVar2) {
                    pvVar6 = (void *)std::istream::operator>>
                                               (local_220,
                                                &(__return_storage_ptr__->super_BaseConfig).observer
                                                 .x);
                    pvVar6 = (void *)std::istream::operator>>
                                               (pvVar6,&(__return_storage_ptr__->super_BaseConfig).
                                                        observer.y);
                    std::istream::operator>>
                              (pvVar6,&(__return_storage_ptr__->super_BaseConfig).observer.z);
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_278,"light");
                    if (bVar2) {
                      pvVar6 = (void *)std::istream::operator>>
                                                 (local_220,
                                                  &(__return_storage_ptr__->super_BaseConfig).light.
                                                   x);
                      pvVar6 = (void *)std::istream::operator>>
                                                 (pvVar6,&(__return_storage_ptr__->super_BaseConfig)
                                                          .light.y);
                      std::istream::operator>>
                                (pvVar6,&(__return_storage_ptr__->super_BaseConfig).light.z);
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_278,"sphere");
                      if (bVar2) {
                        anon_unknown.dwarf_278c4::parseSphere(&local_290,(ifstream *)local_220);
                        std::vector<Sphere,_std::allocator<Sphere>_>::push_back
                                  (&__return_storage_ptr__->spheres,&local_290);
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_278,"plane");
                        if (!bVar2) {
                          piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
                          std::operator+(local_2f8,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)"Unknown token \'");
                          std::operator+(local_2d8,local_2f8);
                          std::invalid_argument::invalid_argument(piVar3,(string *)local_2d8);
                          __cxa_throw(piVar3,&std::invalid_argument::typeinfo,
                                      std::invalid_argument::~invalid_argument);
                        }
                        anon_unknown.dwarf_278c4::parsePlane(&local_2b4,(ifstream *)local_220);
                        std::vector<Plane,_std::allocator<Plane>_>::push_back
                                  (&__return_storage_ptr__->planes,&local_2b4);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar1 = std::ios::good();
  } while ((bVar1 & 1) != 0);
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"Invalid config file format.");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

RayTracerConfig RayTracerConfig::fromFile(std::string const& path)
{
  std::ifstream file(path);
  if (!file.is_open())
    throw std::invalid_argument("Unable to open file: " + path);

  RayTracerConfig config;
  std::string token;
  while (file >> token)
  {
    if (token[0] == '#') // comment, skip entire line
      std::getline(file, token);
    else if (token == "aa")
      file >> config.antiAliasing;
    else if (token == "ambient")
      file >> config.ambientCoefficient;
    else if (token == "maxRecursion")
      file >> config.maxRecursionLevel;
    else if (token == "depth")
      file >> config.imageX;
    else if (token == "height")
      file >> config.imageY;
    else if (token == "width")
      file >> config.imageZ;
    else if (token == "observer")
      file >> config.observer.x >> config.observer.y >> config.observer.z;
    else if (token == "light")
      file >> config.light.x >> config.light.y >> config.light.z;
    else if (token == "sphere")
      config.spheres.push_back(parseSphere(file));
    else if (token == "plane")
      config.planes.push_back(parsePlane(file));
    else
      throw std::invalid_argument("Unknown token '" + token + "'");
    if (!file.good())
      throw std::invalid_argument("Invalid config file format.");
  }
  return config;
}